

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wasm-type.cpp
# Opt level: O2

size_t __thiscall std::hash<wasm::Array>::operator()(hash<wasm::Array> *this,Array *array)

{
  size_t sVar1;
  
  sVar1 = ::wasm::hash<wasm::Field>(&array->element);
  return sVar1;
}

Assistant:

size_t hash<wasm::Array>::operator()(const wasm::Array& array) const {
  return wasm::hash(array.element);
}